

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DODNTSCD.h
# Opt level: O1

pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
* __thiscall
dg::DODNTSCD::compute
          (pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
           *__return_storage_ptr__,DODNTSCD *this,CDGraph *graph)

{
  CDNode *p;
  _Rb_tree_node_base *p_Var1;
  ResultT revCD;
  ResultT CD;
  ResultT allpaths;
  AllMaxPath allmaxpath;
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  local_f8;
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  local_c8;
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>,_std::_Select1st<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>_>
  local_98;
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  AllMaxPath::compute((ResultT *)&local_98,(AllMaxPath *)&local_68,graph);
  for (p_Var1 = (graph->_predicates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(graph->_predicates)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    p = *(CDNode **)(p_Var1 + 1);
    DOD::
    computeDOD<std::map<dg::CDNode*,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&>>>>
              ((DOD *)this,p,graph,
               (map<dg::CDNode_*,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>_>
                *)&local_98,(ResultT *)&local_c8,(ResultT *)&local_f8);
    computeNTSCD<std::map<dg::CDNode*,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&>>>>
              (this,p,graph,
               (map<dg::CDNode_*,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>_>
                *)&local_98,(ResultT *)&local_c8,(ResultT *)&local_f8);
  }
  std::
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::_Rb_tree((_Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
              *)__return_storage_ptr__,&local_c8);
  std::
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::_Rb_tree(&(__return_storage_ptr__->second)._M_t,&local_f8);
  std::
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>,_std::_Select1st<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>_>
  ::_M_erase(&local_98,(_Link_type)local_98._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::_M_erase(&local_f8,(_Link_type)local_f8._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::_M_erase(&local_c8,(_Link_type)local_c8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return __return_storage_ptr__;
}

Assistant:

std::pair<ResultT, ResultT> compute(CDGraph &graph) {
        ResultT CD;
        ResultT revCD;

        DBG_SECTION_BEGIN(cda, "Computing DOD for all predicates");

        AllMaxPath allmaxpath;
        DBG_SECTION_BEGIN(
                cda,
                "Coputing nodes that are on all max paths from nodes for fun "
                        << graph.getName());
        auto allpaths = allmaxpath.compute(graph);
        DBG_SECTION_END(
                cda,
                "Done coputing nodes that are on all max paths from nodes");

        for (auto *p : graph.predicates()) {
            computeDOD(p, graph, allpaths, CD, revCD);
            computeNTSCD(p, graph, allpaths, CD, revCD);
        }

        DBG_SECTION_END(cda, "Finished computing DOD for all predicates");
        return {CD, revCD};
    }